

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O1

lzham_uint32 lzham::lzham_lib_compress_deinit(lzham_compress_state_ptr p)

{
  lzham_uint32 lVar1;
  
  if (p == (lzham_compress_state_ptr)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = *(lzham_uint32 *)((long)p + 0x1a98);
    lzcompressor::~lzcompressor((lzcompressor *)((long)p + 0x2c8));
    task_pool::~task_pool((task_pool *)p);
    lzham_free(p);
  }
  return lVar1;
}

Assistant:

lzham_uint32 lzham_lib_compress_deinit(lzham_compress_state_ptr p)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state *>(p);
      if (!pState)
         return 0;  

      uint32 adler32 = pState->m_compressor.get_src_adler32();

      lzham_delete(pState);

      return adler32;
   }